

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O1

Object<cmCMakePresetsGraph::WorkflowPreset> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<cmCMakePresetsGraph::WorkflowPreset>::
Bind<cmCMakePresetsGraph::WorkflowPreset,std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>>,std::function<cmCMakePresetsGraph::ReadFileResult(std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>>&,Json::Value_const*)>>
          (Object<cmCMakePresetsGraph::WorkflowPreset> *this,string_view *name,
          offset_in_WorkflowPreset_to_vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
          member,function<cmCMakePresetsGraph::ReadFileResult_(std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_&,_const_Json::Value_*)>
                 *func,bool required)

{
  Object<cmCMakePresetsGraph::WorkflowPreset> *pOVar1;
  _Any_data local_70;
  _Manager_type local_60;
  _Any_data local_50;
  _Manager_type local_40;
  offset_in_WorkflowPreset_to_vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
  local_30;
  
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_&,_const_Json::Value_*)>
  ::function((function<cmCMakePresetsGraph::ReadFileResult_(std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_&,_const_Json::Value_*)>
              *)&local_50,func);
  local_30 = member;
  std::
  function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::WorkflowPreset&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::WorkflowPreset>::Bind<cmCMakePresetsGraph::WorkflowPreset,std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>>,std::function<cmCMakePresetsGraph::ReadFileResult(std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>>&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>>cmCMakePresetsGraph::WorkflowPreset::*,std::function<cmCMakePresetsGraph::ReadFileResult(std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>>&,Json::Value_const*)>,bool)::_lambda(cmCMakePresetsGraph::WorkflowPreset&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::WorkflowPreset&,Json::Value_const*)>
              *)local_70._M_pod_data,(anon_class_40_2_315d8239 *)&local_50);
  pOVar1 = BindPrivate(this,name,(MemberFunction *)&local_70,required);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }